

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O2

void __thiscall QToolBox::setCurrentIndex(QToolBox *this,int index)

{
  QToolBoxPrivate *this_00;
  QToolBoxButton *pQVar1;
  Page *pPVar2;
  
  this_00 = *(QToolBoxPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  pPVar2 = QToolBoxPrivate::page(this_00,index);
  if ((pPVar2 != (Page *)0x0) && (this_00->currentPage != pPVar2)) {
    pQVar1 = pPVar2->button;
    pQVar1->selected = true;
    QWidget::update((QWidget *)pQVar1);
    if (this_00->currentPage != (Page *)0x0) {
      QWidget::hide((QWidget *)this_00->currentPage->sv);
      pQVar1 = this_00->currentPage->button;
      pQVar1->selected = false;
      QWidget::update((QWidget *)pQVar1);
    }
    this_00->currentPage = pPVar2;
    QWidget::show((QWidget *)pPVar2->sv);
    QToolBoxPrivate::updateTabs(this_00);
    currentChanged(this,index);
    return;
  }
  return;
}

Assistant:

void QToolBox::setCurrentIndex(int index)
{
    Q_D(QToolBox);
    QToolBoxPrivate::Page *c = d->page(index);
    if (!c || d->currentPage == c)
        return;

    c->button->setSelected(true);
    if (d->currentPage) {
        d->currentPage->sv->hide();
        d->currentPage->button->setSelected(false);
    }
    d->currentPage = c;
    d->currentPage->sv->show();
    d->updateTabs();
    emit currentChanged(index);
}